

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_server.c
# Opt level: O0

int ssl_parse_client_psk_identity(mbedtls_ssl_context *ssl,uchar **p,uchar *end)

{
  ushort uVar1;
  int iVar2;
  int local_2c;
  uint16_t n;
  int ret;
  uchar *end_local;
  uchar **p_local;
  mbedtls_ssl_context *ssl_local;
  
  local_2c = 0;
  iVar2 = ssl_conf_has_psk_or_cb(ssl->conf);
  if (iVar2 == 0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,0xe00,"got no pre-shared key");
    ssl_local._4_4_ = -0x7600;
  }
  else if ((long)end - (long)*p < 2) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,0xe08,"bad client key exchange message");
    ssl_local._4_4_ = -0x7300;
  }
  else {
    uVar1 = CONCAT11(**p,(*p)[1]);
    *p = *p + 2;
    if ((uVar1 == 0) || ((long)end - (long)*p < (long)(ulong)uVar1)) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                 ,0xe10,"bad client key exchange message");
      ssl_local._4_4_ = -0x7300;
    }
    else {
      if (ssl->conf->f_psk == (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0) {
        if (((ulong)uVar1 != ssl->conf->psk_identity_len) ||
           (iVar2 = mbedtls_ct_memcmp(ssl->conf->psk_identity,*p,(ulong)uVar1), iVar2 != 0)) {
          local_2c = -0x6c80;
        }
      }
      else {
        iVar2 = (*ssl->conf->f_psk)(ssl->conf->p_psk,ssl,*p,(size_t)uVar1);
        if (iVar2 != 0) {
          local_2c = -0x6c80;
        }
      }
      if (local_2c == -0x6c80) {
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                   ,0xe22,"Unknown PSK identity",*p,(ulong)uVar1);
        mbedtls_ssl_send_alert_message(ssl,'\x02','s');
        ssl_local._4_4_ = -0x6c80;
      }
      else {
        *p = *p + (int)(uint)uVar1;
        ssl_local._4_4_ = 0;
      }
    }
  }
  return ssl_local._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_parse_client_psk_identity(mbedtls_ssl_context *ssl, unsigned char **p,
                                         const unsigned char *end)
{
    int ret = 0;
    uint16_t n;

    if (ssl_conf_has_psk_or_cb(ssl->conf) == 0) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("got no pre-shared key"));
        return MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED;
    }

    /*
     * Receive client pre-shared key identity name
     */
    if (end - *p < 2) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("bad client key exchange message"));
        return MBEDTLS_ERR_SSL_DECODE_ERROR;
    }

    n = ((*p)[0] << 8) | (*p)[1];
    *p += 2;

    if (n == 0 || n > end - *p) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("bad client key exchange message"));
        return MBEDTLS_ERR_SSL_DECODE_ERROR;
    }

    if (ssl->conf->f_psk != NULL) {
        if (ssl->conf->f_psk(ssl->conf->p_psk, ssl, *p, n) != 0) {
            ret = MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY;
        }
    } else {
        /* Identity is not a big secret since clients send it in the clear,
         * but treat it carefully anyway, just in case */
        if (n != ssl->conf->psk_identity_len ||
            mbedtls_ct_memcmp(ssl->conf->psk_identity, *p, n) != 0) {
            ret = MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY;
        }
    }

    if (ret == MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY) {
        MBEDTLS_SSL_DEBUG_BUF(3, "Unknown PSK identity", *p, n);
        mbedtls_ssl_send_alert_message(ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                       MBEDTLS_SSL_ALERT_MSG_UNKNOWN_PSK_IDENTITY);
        return MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY;
    }

    *p += n;

    return 0;
}